

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

void Abc_SclHashCells(SC_Lib *p)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  if (p->nBins != 0) {
    __assert_fail("p->nBins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                  ,0x45,"void Abc_SclHashCells(SC_Lib *)");
  }
  uVar3 = (p->vCells).nSize * 5 - 1;
  while( true ) {
    do {
      uVar4 = uVar3 + 1;
      uVar1 = uVar3 & 1;
      uVar3 = uVar4;
    } while (uVar1 != 0);
    if (uVar4 < 9) break;
    iVar5 = 5;
    while (uVar4 % (iVar5 - 2U) != 0) {
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar4 < uVar1) goto LAB_003d90fb;
    }
  }
LAB_003d90fb:
  p->nBins = uVar4;
  piVar2 = (int *)malloc((long)(int)uVar4 << 2);
  memset(piVar2,0xff,(long)(int)uVar4 << 2);
  p->pBins = piVar2;
  if (0 < (p->vCells).nSize) {
    lVar6 = 0;
    do {
      piVar2 = Abc_SclHashLookup(p,*(p->vCells).pArray[lVar6]);
      if (*piVar2 != -1) {
        __assert_fail("*pPlace == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                      ,0x4b,"void Abc_SclHashCells(SC_Lib *)");
      }
      *piVar2 = (int)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vCells).nSize);
  }
  return;
}

Assistant:

void Abc_SclHashCells( SC_Lib * p )
{
    SC_Cell * pCell;
    int i, * pPlace;
    assert( p->nBins == 0 );
    p->nBins = Abc_PrimeCudd( 5 * SC_LibCellNum(p) );
    p->pBins = ABC_FALLOC( int, p->nBins );
    SC_LibForEachCell( p, pCell, i )
    {
        pPlace = Abc_SclHashLookup( p, pCell->pName );
        assert( *pPlace == -1 );
        *pPlace = i;
    }
}